

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

ObjFunction * newFunction(void)

{
  undefined8 in_RAX;
  ObjFunction *pOVar1;
  ObjFunction *function;
  
  pOVar1 = (ObjFunction *)allocateObject((size_t)function,(ObjType)((ulong)in_RAX >> 0x20));
  pOVar1->arity = 0;
  pOVar1->upvalueCount = 0;
  pOVar1->name = (ObjString *)0x0;
  initChunk((Chunk *)0x108b33);
  return pOVar1;
}

Assistant:

ObjFunction *newFunction() {
    ObjFunction *function = ALLOCATE_OBJ(ObjFunction, OBJ_FUNCTION);

    function->arity = 0;
    function->upvalueCount = 0;

    function->name = NULL;
    initChunk(&function->chunk);
    return function;
}